

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O0

bool __thiscall
helics::NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6>::brokerConnect
          (NetworkBroker<helics::tcp::TcpComms,_(gmlc::networking::InterfaceTypes)0,_6> *this)

{
  milliseconds timeOut;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  milliseconds mVar5;
  pointer this_00;
  socklen_t in_ECX;
  sockaddr *__addr;
  CoreBroker *in_RDI;
  bool res;
  lock_guard<std::mutex> lock;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  CLI::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
             ,(mutex_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a3b05);
  if ((bVar1) &&
     (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a3b20),
     bVar1)) {
    CoreBroker::setAsRoot
              ((CoreBroker *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  in_RDI[1].super_BrokerBase.actionQueue.m_pushLock.super___mutex_base._M_mutex.__size[10] =
       (in_RDI->super_BrokerBase).useJsonSerialization & 1;
  in_RDI[1].super_BrokerBase.actionQueue.m_pushLock.super___mutex_base._M_mutex.__size[0xb] =
       (in_RDI->super_BrokerBase).observer & 1;
  CLI::std::unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>::
  operator->((unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_> *)
             0x4a3b7e);
  CoreBroker::getIdentifier_abi_cxx11_(in_RDI);
  CommsInterface::setName
            ((CommsInterface *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  CLI::std::unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>::
  operator->((unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_> *)
             0x4a3bb6);
  tcp::TcpComms::loadNetworkInfo
            ((TcpComms *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (NetworkBrokerData *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  CLI::std::unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>::
  operator->((unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_> *)
             0x4a3bdd);
  mVar5 = TimeRepresentation<count_time<9,_long>_>::to_ms
                    ((TimeRepresentation<count_time<9,_long>_> *)
                     CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  iVar4 = (int)mVar5.__r;
  timeOut.__r._4_4_ = in_stack_ffffffffffffffa4;
  timeOut.__r._0_4_ = in_stack_ffffffffffffffa0;
  CommsInterface::setTimeout
            ((CommsInterface *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),timeOut
            );
  this_00 = CLI::std::unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>
            ::operator->((unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>
                          *)0x4a3c23);
  uVar3 = CommsInterface::connect((CommsInterface *)this_00,iVar4,__addr,in_ECX);
  bVar2 = (byte)uVar3 & 1;
  if (((uVar3 & 1) != 0) &&
     (iVar4._0_1_ = in_RDI[1].super_BrokerBase.disableDynamicSources,
     iVar4._1_1_ = in_RDI[1].super_BrokerBase.mainLoopIsRunning,
     iVar4._2_1_ = in_RDI[1].super_BrokerBase.dumplog,
     iVar4._3_1_ = in_RDI[1].super_BrokerBase.queueDisabled, iVar4 < 0)) {
    CLI::std::unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>::
    operator->((unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_> *)
               0x4a3c61);
    iVar4 = NetworkCommsInterface::getPort((NetworkCommsInterface *)0x4a3c69);
    in_RDI[1].super_BrokerBase.disableDynamicSources = (bool)(char)iVar4;
    in_RDI[1].super_BrokerBase.mainLoopIsRunning = (atomic<bool>)(char)((uint)iVar4 >> 8);
    in_RDI[1].super_BrokerBase.dumplog = (bool)(char)((uint)iVar4 >> 0x10);
    in_RDI[1].super_BrokerBase.queueDisabled = (bool)(char)((uint)iVar4 >> 0x18);
  }
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4a3c92);
  return (bool)(bVar2 & 1);
}

Assistant:

bool NetworkBroker<COMMS, baseline, tcode>::brokerConnect()
{
    std::lock_guard<std::mutex> lock(dataMutex);
    if ((netInfo.brokerName.empty()) && (netInfo.brokerAddress.empty())) {
        CoreBroker::setAsRoot();
    }
    netInfo.useJsonSerialization = BrokerBase::useJsonSerialization;
    netInfo.observer = BrokerBase::observer;
    CommsBroker<COMMS, CoreBroker>::comms->setName(CoreBroker::getIdentifier());
    CommsBroker<COMMS, CoreBroker>::comms->loadNetworkInfo(netInfo);
    CommsBroker<COMMS, CoreBroker>::comms->setTimeout(BrokerBase::networkTimeout.to_ms());

    auto res = CommsBroker<COMMS, CoreBroker>::comms->connect();
    if (res) {
        if (netInfo.portNumber < 0) {
            netInfo.portNumber = CommsBroker<COMMS, CoreBroker>::comms->getPort();
        }
    }
    return res;
}